

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomdpx.cpp
# Opt level: O1

void __thiscall despot::POMDPX::POMDPX(POMDPX *this,string *params_file)

{
  ValuedAction *this_00;
  double *pdVar1;
  pointer pcVar2;
  pointer pNVar3;
  int iVar4;
  Parser *this_01;
  log_ostream *plVar5;
  ostream *poVar6;
  long *plVar7;
  int s;
  long lVar8;
  int a;
  long lVar9;
  long lVar10;
  double dVar11;
  double dVar12;
  ValuedAction VVar13;
  double local_68;
  string local_60;
  ValuedAction local_40;
  
  (this->super_MDP)._vptr_MDP = (_func_int **)&PTR__MDP_00190288;
  (this->super_MDP).policy_.
  super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_MDP).policy_.
  super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_MDP).policy_.
  super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_MDP).blind_alpha_.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_MDP).blind_alpha_.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_MDP).blind_alpha_.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  DSPOMDP::DSPOMDP(&this->super_DSPOMDP);
  (this->super_MDP)._vptr_MDP = (_func_int **)&PTR__POMDPX_00190b38;
  (this->super_DSPOMDP)._vptr_DSPOMDP = (_func_int **)&PTR__POMDPX_00190c38;
  (this->super_StateIndexer)._vptr_StateIndexer = (_func_int **)&PTR__POMDPX_00190d18;
  (this->super_StatePolicy)._vptr_StatePolicy = (_func_int **)&PTR__POMDPX_00190d50;
  this_00 = &this->min_reward_action_;
  ValuedAction::ValuedAction(this_00);
  ValuedAction::ValuedAction(&this->max_reward_action_);
  (this->default_action_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->default_action_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->default_action_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->states_).super__Vector_base<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->states_).super__Vector_base<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->states_).super__Vector_base<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->transition_probabilities_).
  super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->transition_probabilities_).
  super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->transition_probabilities_).
  super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->rewards_).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->rewards_).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->rewards_).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->memory_pool_).chunks_.
  super__Vector_base<despot::MemoryPool<despot::POMDPXState>::Chunk_*,_std::allocator<despot::MemoryPool<despot::POMDPXState>::Chunk_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->memory_pool_).chunks_.
  super__Vector_base<despot::MemoryPool<despot::POMDPXState>::Chunk_*,_std::allocator<despot::MemoryPool<despot::POMDPXState>::Chunk_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->memory_pool_).chunks_.
  super__Vector_base<despot::MemoryPool<despot::POMDPXState>::Chunk_*,_std::allocator<despot::MemoryPool<despot::POMDPXState>::Chunk_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->memory_pool_).freelist_.
  super__Vector_base<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->memory_pool_).freelist_.
  super__Vector_base<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->memory_pool_).freelist_.
           super__Vector_base<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_>._M_impl
           .super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->memory_pool_).freelist_.
           super__Vector_base<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_>._M_impl
           .super__Vector_impl_data._M_end_of_storage + 4) = 0;
  current_ = this;
  this_01 = (Parser *)operator_new(0x228);
  pcVar2 = (params_file->_M_dataplus)._M_p;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar2,pcVar2 + params_file->_M_string_length);
  Parser::Parser(this_01,&local_60);
  this->parser_ = this_01;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  VVar13 = Parser::ComputeMaxRewardAction(this->parser_);
  (this->max_reward_action_).action = VVar13.action;
  (this->max_reward_action_).value = VVar13.value;
  iVar4 = logging::level();
  if (0 < iVar4) {
    iVar4 = logging::level();
    if (2 < iVar4) {
      plVar5 = logging::stream(3);
      std::__ostream_insert<char,std::char_traits<char>>
                (&plVar5->super_ostream,"Max reward action = ",0x14);
      poVar6 = despot::operator<<(&plVar5->super_ostream,&this->max_reward_action_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
    }
  }
  VVar13 = Parser::ComputeMinRewardAction(this->parser_);
  (this->min_reward_action_).action = VVar13.action;
  (this->min_reward_action_).value = VVar13.value;
  iVar4 = logging::level();
  if (0 < iVar4) {
    iVar4 = logging::level();
    if (2 < iVar4) {
      plVar5 = logging::stream(3);
      std::__ostream_insert<char,std::char_traits<char>>
                (&plVar5->super_ostream,"Min reward action = ",0x14);
      poVar6 = despot::operator<<(&plVar5->super_ostream,this_00);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
    }
  }
  iVar4 = logging::level();
  if (0 < iVar4) {
    iVar4 = logging::level();
    if (2 < iVar4) {
      plVar5 = logging::stream(3);
      std::__ostream_insert<char,std::char_traits<char>>
                (&plVar5->super_ostream,"#State / log2(#State) = ",0x18);
      iVar4 = Parser::NumStates(this->parser_);
      poVar6 = (ostream *)std::ostream::operator<<(plVar5,iVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," / ",3);
      dVar11 = Parser::LogNumStates(this->parser_);
      poVar6 = std::ostream::_M_insert<double>(dVar11);
      std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
    }
  }
  iVar4 = logging::level();
  if (0 < iVar4) {
    iVar4 = logging::level();
    if (2 < iVar4) {
      plVar5 = logging::stream(3);
      std::__ostream_insert<char,std::char_traits<char>>
                (&plVar5->super_ostream,"#InitState / log2(#InitState) = ",0x20);
      iVar4 = Parser::NumInitialStates(this->parser_);
      poVar6 = (ostream *)std::ostream::operator<<(plVar5,iVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," / ",3);
      dVar11 = Parser::LogNumInitialStates(this->parser_);
      poVar6 = std::ostream::_M_insert<double>(dVar11);
      std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
    }
  }
  iVar4 = logging::level();
  if (0 < iVar4) {
    iVar4 = logging::level();
    if (2 < iVar4) {
      plVar5 = logging::stream(3);
      std::__ostream_insert<char,std::char_traits<char>>(&plVar5->super_ostream,"#Action = ",10);
      pNVar3 = (this->parser_->action_vars_).
               super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>._M_impl.
               super__Vector_impl_data._M_start;
      plVar7 = (long *)std::ostream::operator<<
                                 (plVar5,(int)((ulong)((long)(pNVar3->super_Variable).values_.
                                                                                                                          
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  *(long *)&(pNVar3->super_Variable).values_.
                                                                                                                        
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data) >> 5));
      std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
      std::ostream::put((char)plVar7);
      std::ostream::flush();
    }
  }
  iVar4 = logging::level();
  if (0 < iVar4) {
    iVar4 = logging::level();
    if (2 < iVar4) {
      plVar5 = logging::stream(3);
      std::__ostream_insert<char,std::char_traits<char>>
                (&plVar5->super_ostream,"#Obs / log2(#Obs) = ",0x14);
      Parser::NumObservations(this->parser_);
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)plVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," / ",3);
      dVar11 = Parser::LogNumObservations(this->parser_);
      poVar6 = std::ostream::_M_insert<double>(dVar11);
      std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
    }
  }
  dVar11 = Parser::LogNumStates(this->parser_);
  this->is_small_ = dVar11 <= 15.0;
  if (dVar11 <= 15.0) {
    InitStates(this);
    InitTransitions(this);
    InitRewards(this);
    local_68 = INFINITY;
    lVar9 = 0;
    while( true ) {
      iVar4 = (*(this->super_MDP)._vptr_MDP[3])(this);
      if (iVar4 <= lVar9) break;
      lVar10 = 0;
      lVar8 = 0;
      dVar11 = local_68;
      while( true ) {
        iVar4 = (*(this->super_MDP)._vptr_MDP[2])(this);
        if (iVar4 <= lVar8) break;
        dVar12 = *(double *)
                  (*(long *)((long)&(((this->rewards_).
                                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                    super__Vector_impl_data._M_start + lVar10) + lVar9 * 8);
        if (dVar11 <= dVar12) {
          dVar12 = dVar11;
        }
        lVar8 = lVar8 + 1;
        lVar10 = lVar10 + 0x18;
        dVar11 = dVar12;
      }
      pdVar1 = &(this->min_reward_action_).value;
      if (*pdVar1 <= dVar11 && dVar11 != *pdVar1) {
        ValuedAction::ValuedAction(&local_40,(ACT_TYPE)lVar9,dVar11);
        this_00->action = local_40.action;
        *(undefined4 *)&this_00->field_0x4 = local_40._4_4_;
        (this->min_reward_action_).value = local_40.value;
      }
      lVar9 = lVar9 + 1;
    }
  }
  return;
}

Assistant:

POMDPX::POMDPX(string params_file) {
	current_ = this;
	parser_ = new Parser(params_file);

	max_reward_action_ = parser_->ComputeMaxRewardAction();
	logi << "Max reward action = " << max_reward_action_ << " ";
	min_reward_action_ = parser_->ComputeMinRewardAction();
	logi << "Min reward action = " << min_reward_action_ << " ";
	logi << "#State / log2(#State) = " << parser_->NumStates() << " / "
		<< parser_->LogNumStates() << endl;
	logi << "#InitState / log2(#InitState) = " << parser_->NumInitialStates()
		<< " / " << parser_->LogNumInitialStates() << endl;
	logi << "#Action = " << parser_->NumActions() << endl;
	logi << "#Obs / log2(#Obs) = " << parser_->NumObservations() << " / "
		<< parser_->LogNumObservations() << endl;

	is_small_ = (parser_->LogNumStates() <= 15);

	if (is_small_) {
		InitStates();
		InitTransitions();
		InitRewards(); // Must be called after initializing transitions

		for (int a = 0; a < NumActions(); a++) {
			double min_reward = Globals::POS_INFTY;

			for (int s = 0; s < NumStates(); s++) {
				if (rewards_[s][a] < min_reward) {
					min_reward = rewards_[s][a];
				}
			}

			if (min_reward > min_reward_action_.value) {
				min_reward_action_ = ValuedAction(a, min_reward);
			}
		}
	}
}